

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O2

void __thiscall
ot::commissioner::ProxyClient::SendRequest
          (ProxyClient *this,Request *aRequest,ResponseHandler *aHandler,uint16_t aPeerAloc16,
          uint16_t aPeerPort)

{
  _func_void *p_Var1;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> local_108;
  undefined1 local_e8 [144];
  _Any_data local_58;
  long local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if ((this->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_e8._0_8_ = this;
    coap::Message::Message((Message *)(local_e8 + 8),aRequest);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
              ((function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> *)
               &local_58,aHandler);
    local_38 = CONCAT22(aPeerPort,aPeerAloc16);
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    local_118 = (code *)0x0;
    pcStack_110 = (code *)0x0;
    p_Var1 = (_func_void *)operator_new(0xb8);
    *(undefined8 *)p_Var1 = local_e8._0_8_;
    coap::Message::Message((Message *)(p_Var1 + 8),(Message *)(local_e8 + 8));
    *(undefined8 *)(p_Var1 + 0x90) = 0;
    *(undefined8 *)(p_Var1 + 0x98) = 0;
    *(undefined8 *)(p_Var1 + 0xa0) = 0;
    *(undefined8 *)(p_Var1 + 0xa8) = uStack_40;
    if (local_48 != 0) {
      *(void **)(p_Var1 + 0x90) = local_58._M_unused._M_object;
      *(undefined8 *)(p_Var1 + 0x98) = local_58._8_8_;
      *(long *)(p_Var1 + 0xa0) = local_48;
      local_48 = 0;
      uStack_40 = 0;
    }
    *(undefined4 *)(p_Var1 + 0xb0) = local_38;
    pcStack_110 = std::
                  _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/udp_proxy.cpp:110:30)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/udp_proxy.cpp:110:30)>
                ::_M_manager;
    local_128._M_unused._0_8_ = (undefined8)p_Var1;
    FetchMeshLocalPrefix(this,(ErrorHandler *)&local_128);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    SendRequest(ot::commissioner::coap::Message_const&,std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>,unsigned_short,unsigned_short)
    ::$_0::~__0((__0 *)local_e8);
  }
  else {
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
              (&local_108,aHandler);
    GetAnycastLocator((Address *)local_e8,this,aPeerAloc16);
    SendRequest(this,aRequest,&local_108,(Address *)local_e8,aPeerPort);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8);
    std::_Function_base::~_Function_base(&local_108.super__Function_base);
  }
  return;
}

Assistant:

void ProxyClient::SendRequest(const coap::Request  &aRequest,
                              coap::ResponseHandler aHandler,
                              uint16_t              aPeerAloc16,
                              uint16_t              aPeerPort)
{
    if (mMeshLocalPrefix.empty())
    {
        FetchMeshLocalPrefix([=](Error aError) {
            if (aError == ErrorCode::kNone)
            {
                SendRequest(aRequest, aHandler, GetAnycastLocator(aPeerAloc16), aPeerPort);
            }
            else
            {
                aHandler(nullptr, aError);
            }
        });
    }
    else
    {
        SendRequest(aRequest, aHandler, GetAnycastLocator(aPeerAloc16), aPeerPort);
    }
}